

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  TypeFunction *pTVar1;
  TypeHandle *pTVar2;
  IntrusiveList<TypeHandle> *pIVar3;
  TypeHandle *pTVar4;
  NodeIterator it;
  
  it = DirectChainedMap<TypeFunction_*>::first(table,hash);
  if (it.node != (Node *)0x0) {
    for (; it.node != (Node *)0x0; it = DirectChainedMap<TypeFunction_*>::next(table,it)) {
      pTVar1 = *(TypeFunction **)(it.node + 8);
      if (pTVar1->returnType == returnType) {
        pIVar3 = &pTVar1->arguments;
        for (pTVar4 = arguments.head;
            ((pTVar2 = pIVar3->head, pTVar2 != (TypeHandle *)0x0 && (pTVar4 != (TypeHandle *)0x0))
            && (pTVar2->type == pTVar4->type)); pTVar4 = pTVar4->next) {
          pIVar3 = (IntrusiveList<TypeHandle> *)&pTVar2->next;
        }
        if (pTVar2 == pTVar4) {
          return pTVar1;
        }
      }
    }
  }
  return (TypeFunction *)0x0;
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;
			TypeHandle *rightArg = arguments.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}